

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O2

void ncnn::pack_B_tile_int8_avx2(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  long lVar5;
  long lVar6;
  undefined1 auVar7 [32];
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar19 [32];
  
  iVar8 = cpu_support_x86_avx_vnni_int8();
  if (iVar8 != 0) {
    pack_B_tile_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk);
    return;
  }
  iVar8 = cpu_support_x86_avx_vnni();
  auVar7 = _DAT_005439a0;
  if (iVar8 == 0) {
    pauVar13 = (undefined1 (*) [16])BT->data;
    lVar9 = (long)k;
    lVar10 = (long)j;
    lVar11 = (long)max_jj;
    lVar14 = lVar10 + 1;
    uVar12 = 0;
    auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar17._8_4_ = 0xc080400;
    auVar17._0_8_ = 0xc0804000c080400;
    auVar17._12_4_ = 0xc080400;
    auVar17._16_4_ = 0xc080400;
    auVar17._20_4_ = 0xc080400;
    auVar17._24_4_ = 0xc080400;
    auVar17._28_4_ = 0xc080400;
    for (; (long)(uVar12 | 7) < lVar11; uVar12 = uVar12 + 8) {
      iVar8 = B->w;
      auVar19._4_4_ = iVar8;
      auVar19._0_4_ = iVar8;
      auVar19._8_4_ = iVar8;
      auVar19._12_4_ = iVar8;
      auVar19._16_4_ = iVar8;
      auVar19._20_4_ = iVar8;
      auVar19._24_4_ = iVar8;
      auVar19._28_4_ = iVar8;
      vpmulld_avx2(auVar19,auVar4);
      for (iVar8 = 0; iVar8 + 1 < max_kk; iVar8 = iVar8 + 2) {
        auVar19 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
        auVar19 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19);
        auVar19 = vpshufb_avx2(auVar19,auVar7);
        auVar19 = vpermq_avx2(auVar19,0xe8);
        in_ZMM4 = ZEXT3264(auVar19);
        *pauVar13 = auVar19._0_16_;
        pauVar13 = pauVar13 + 1;
      }
      for (; iVar8 < max_kk; iVar8 = iVar8 + 1) {
        auVar19 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
        auVar19 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19);
        auVar19 = vpshufb_avx2(auVar19,auVar17);
        auVar3 = vpunpckldq_avx(auVar19._0_16_,auVar19._16_16_);
        in_ZMM4 = ZEXT1664(auVar3);
        *(long *)*pauVar13 = auVar3._0_8_;
        pauVar13 = (undefined1 (*) [16])((long)*pauVar13 + 8);
      }
      lVar10 = lVar10 + 8;
      lVar14 = lVar14 + 8;
    }
    auVar3 = vpmovsxbd_avx(ZEXT416(0x3020100));
    for (; (long)(uVar12 | 3) < lVar11; uVar12 = uVar12 + 4) {
      iVar8 = B->w;
      auVar18._4_4_ = iVar8;
      auVar18._0_4_ = iVar8;
      auVar18._8_4_ = iVar8;
      auVar18._12_4_ = iVar8;
      vpmulld_avx(auVar18,auVar3);
      for (iVar8 = 0; iVar8 + 1 < max_kk; iVar8 = iVar8 + 2) {
        auVar18 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar18 = vpgatherdd((undefined1  [16])0x0,auVar18);
        auVar18 = vpshufb_avx(auVar18,ZEXT816(0xd0c090805040100));
        in_ZMM4 = ZEXT1664(auVar18);
        *(long *)*pauVar13 = auVar18._0_8_;
        pauVar13 = (undefined1 (*) [16])((long)*pauVar13 + 8);
      }
      for (; iVar8 < max_kk; iVar8 = iVar8 + 1) {
        auVar18 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar18 = vpgatherdd((undefined1  [16])0x0,auVar18);
        auVar18 = vpshufb_avx(auVar18,SUB6416(ZEXT464(0xc080400),0));
        in_ZMM4 = ZEXT1664(auVar18);
        *(int *)*pauVar13 = auVar18._0_4_;
        pauVar13 = (undefined1 (*) [16])((long)*pauVar13 + 4);
      }
      lVar10 = lVar10 + 4;
      lVar14 = lVar14 + 4;
    }
    for (; (long)(uVar12 | 1) < lVar11; uVar12 = uVar12 + 2) {
      pvVar1 = B->data;
      lVar5 = B->elemsize * lVar10 * (long)B->w + lVar9;
      lVar6 = B->elemsize * lVar14 * (long)B->w + lVar9;
      pauVar15 = pauVar13;
      for (lVar16 = 0; (int)lVar16 + 1 < max_kk; lVar16 = lVar16 + 2) {
        *(undefined1 *)((long)*pauVar13 + lVar16 * 2) =
             *(undefined1 *)((long)pvVar1 + lVar16 + lVar5);
        *(undefined1 *)((long)*pauVar13 + lVar16 * 2 + 1) =
             *(undefined1 *)((long)pvVar1 + lVar16 + lVar5 + 1);
        *(undefined1 *)((long)*pauVar13 + lVar16 * 2 + 2) =
             *(undefined1 *)((long)pvVar1 + lVar16 + lVar6);
        *(undefined1 *)((long)*pauVar13 + lVar16 * 2 + 3) =
             *(undefined1 *)((long)pvVar1 + lVar16 + lVar6 + 1);
        pauVar15 = (undefined1 (*) [16])((long)*pauVar15 + 4);
      }
      for (; pauVar13 = pauVar15, (int)lVar16 < max_kk; lVar16 = lVar16 + 1) {
        (*pauVar13)[0] = *(undefined1 *)((long)pvVar1 + lVar16 + lVar5);
        *(undefined1 *)((long)*pauVar13 + 1) = *(undefined1 *)((long)pvVar1 + lVar16 + lVar6);
        pauVar15 = (undefined1 (*) [16])((long)*pauVar13 + 2);
      }
      lVar10 = lVar10 + 2;
      lVar14 = lVar14 + 2;
    }
    if (max_kk < 1) {
      max_kk = 0;
    }
    for (; (long)uVar12 < lVar11; uVar12 = uVar12 + 1) {
      iVar8 = B->w;
      pvVar1 = B->data;
      sVar2 = B->elemsize;
      for (lVar14 = 0; max_kk != (int)lVar14; lVar14 = lVar14 + 1) {
        *(undefined1 *)((long)*pauVar13 + lVar14) =
             *(undefined1 *)((long)pvVar1 + lVar14 + sVar2 * lVar10 * (long)iVar8 + lVar9);
      }
      pauVar13 = (undefined1 (*) [16])((long)*pauVar13 + lVar14);
      lVar10 = lVar10 + 1;
    }
    return;
  }
  pack_B_tile_int8_avxvnni(B,BT,j,max_jj,k,max_kk);
  return;
}

Assistant:

void pack_B_tile_int8_avx2(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}